

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktMemoryPipelineBarrierTests.cpp
# Opt level: O1

void __thiscall
vkt::memory::anon_unknown_0::RenderVertexSampledImage::prepare
          (RenderVertexSampledImage *this,PrepareRenderPassContext *context)

{
  VkDescriptorPool *pVVar1;
  VkRenderPass renderPass;
  Context *pCVar2;
  DeviceInterface *deviceInterface;
  VkDevice device;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
  *p_Var3;
  VkDescriptorPool obj;
  VkDescriptorPoolSize VVar4;
  DeviceInterface *pDVar5;
  VkImageView obj_00;
  VkSampler obj_01;
  VkAllocationCallbacks *pVVar6;
  const_iterator cVar7;
  long lVar8;
  undefined8 *puVar9;
  VkSamplerCreateInfo *pVVar10;
  byte bVar11;
  VkDescriptorImageInfo imageInfo;
  undefined8 uStack_150;
  VkDescriptorSetAllocateInfo allocateInfo;
  VkDescriptorPoolSize poolSizes;
  Deleter<vk::Handle<(vk::HandleType)13>_> DStack_110;
  vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  bindings;
  VkDescriptorSetLayoutBinding binding;
  VkShaderModule local_78;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_70;
  VkShaderModule local_58;
  Deleter<vk::Handle<(vk::HandleType)14>_> DStack_50;
  VkDescriptorSetLayout layout;
  
  bVar11 = 0;
  renderPass.m_internal = (context->m_renderPass).m_internal;
  pCVar2 = context->m_context->m_context;
  deviceInterface = pCVar2->m_vkd;
  device = pCVar2->m_device;
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  pVVar1 = &allocateInfo.descriptorPool;
  allocateInfo._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&allocateInfo,"sampled-image.vert","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,
             *(ProgramBinary **)(cVar7._M_node + 2),0);
  DStack_50.m_device = (VkDevice)binding.pImmutableSamplers;
  local_58.m_internal._0_4_ = binding.binding;
  local_58.m_internal._4_4_ = binding.descriptorType;
  DStack_50.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  if ((VkDescriptorPool *)allocateInfo._0_8_ != pVVar1) {
    operator_delete((void *)allocateInfo._0_8_,allocateInfo.descriptorPool.m_internal + 1);
  }
  p_Var3 = (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
            *)context->m_context->m_context->m_binaryCollection;
  allocateInfo._0_8_ = pVVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&allocateInfo,"render-white.frag","");
  cVar7 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_vk::ProgramBinary_*>_>_>
          ::find(p_Var3,(key_type *)&allocateInfo);
  ::vk::createShaderModule
            ((Move<vk::Handle<(vk::HandleType)14>_> *)&binding,deviceInterface,device,
             *(ProgramBinary **)(cVar7._M_node + 2),0);
  DStack_70.m_device = (VkDevice)binding.pImmutableSamplers;
  DStack_70.m_allocator = (VkAllocationCallbacks *)0x0;
  local_78.m_internal._0_4_ = binding.binding;
  local_78.m_internal._4_4_ = binding.descriptorType;
  DStack_70.m_deviceIface = (DeviceInterface *)binding._8_8_;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  if ((VkDescriptorPool *)allocateInfo._0_8_ != pVVar1) {
    operator_delete((void *)allocateInfo._0_8_,allocateInfo.descriptorPool.m_internal + 1);
  }
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  bindings.
  super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  binding.pImmutableSamplers = (VkSampler *)0x0;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  binding.descriptorCount = 1;
  binding.stageFlags = 1;
  std::vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>::
  _M_realloc_insert<vk::VkDescriptorSetLayoutBinding_const&>
            ((vector<vk::VkDescriptorSetLayoutBinding,std::allocator<vk::VkDescriptorSetLayoutBinding>>
              *)&bindings,(iterator)0x0,&binding);
  binding.pImmutableSamplers = (VkSampler *)0x0;
  binding.binding = 0;
  binding.descriptorType = VK_DESCRIPTOR_TYPE_SAMPLER;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  allocateInfo.descriptorPool.m_internal = 0;
  allocateInfo.sType = VK_STRUCTURE_TYPE_APPLICATION_INFO;
  allocateInfo._4_4_ = 0;
  allocateInfo.pNext = (void *)0x0;
  createPipelineWithResources
            (deviceInterface,device,renderPass,(deUint32)&local_58,&local_78,
             (VkShaderModule *)(ulong)(uint)context->m_targetWidth,context->m_targetHeight,
             (deUint32)&binding,
             (vector<vk::VkVertexInputBindingDescription,_std::allocator<vk::VkVertexInputBindingDescription>_>
              *)&allocateInfo,
             (vector<vk::VkVertexInputAttributeDescription,_std::allocator<vk::VkVertexInputAttributeDescription>_>
              *)&bindings,
             (vector<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
              *)0x0,VK_PRIMITIVE_TOPOLOGY_POINT_LIST,0,(VkPushConstantRange *)&this->m_resources,
             (PipelineResources *)imageInfo.sampler.m_internal);
  if (allocateInfo._0_8_ != 0) {
    operator_delete((void *)allocateInfo._0_8_,
                    allocateInfo.descriptorPool.m_internal - allocateInfo._0_8_);
  }
  if (binding._0_8_ != 0) {
    operator_delete((void *)binding._0_8_,(long)binding.pImmutableSamplers - binding._0_8_);
  }
  poolSizes.type = VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER;
  poolSizes.descriptorCount = 1;
  binding.binding = 0x21;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)0x100000001;
  ::vk::createDescriptorPool
            ((Move<vk::Handle<(vk::HandleType)21>_> *)&imageInfo,deviceInterface,device,
             (VkDescriptorPoolCreateInfo *)&binding,(VkAllocationCallbacks *)0x0);
  allocateInfo.descriptorPool.m_internal = imageInfo._16_8_;
  allocateInfo._24_8_ = uStack_150;
  allocateInfo._0_8_ = imageInfo.sampler.m_internal;
  allocateInfo.pNext = (void *)imageInfo.imageView.m_internal;
  imageInfo.sampler.m_internal = 0;
  imageInfo.imageView.m_internal = 0;
  imageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageInfo._20_4_ = 0;
  obj.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              (&(this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.
                deleter,obj);
  }
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_device =
       (VkDevice)allocateInfo.descriptorPool.m_internal;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.m_allocator
       = (VkAllocationCallbacks *)allocateInfo._24_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.m_internal =
       allocateInfo._0_8_;
  (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.deleter.
  m_deviceIface = (DeviceInterface *)allocateInfo.pNext;
  if (imageInfo.sampler.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)21>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)21>_> *)&imageInfo.imageView,
               (VkDescriptorPool)imageInfo.sampler.m_internal);
  }
  layout.m_internal =
       (this->m_resources).descriptorSetLayout.super_RefBase<vk::Handle<(vk::HandleType)19>_>.m_data
       .object.m_internal;
  allocateInfo.pSetLayouts = &layout;
  allocateInfo.sType = VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO;
  allocateInfo.pNext = (void *)0x0;
  allocateInfo.descriptorPool.m_internal =
       (this->m_descriptorPool).super_RefBase<vk::Handle<(vk::HandleType)21>_>.m_data.object.
       m_internal;
  allocateInfo.descriptorSetCount = 1;
  ::vk::allocateDescriptorSet
            ((Move<vk::Handle<(vk::HandleType)22>_> *)&imageInfo,deviceInterface,device,
             &allocateInfo);
  binding.pImmutableSamplers = (VkSampler *)imageInfo._16_8_;
  binding.binding = (undefined4)imageInfo.sampler.m_internal;
  binding.descriptorType = imageInfo.sampler.m_internal._4_4_;
  binding.descriptorCount = (undefined4)imageInfo.imageView.m_internal;
  binding.stageFlags = imageInfo.imageView.m_internal._4_4_;
  imageInfo.sampler.m_internal = 0;
  imageInfo.imageView.m_internal = 0;
  imageInfo.imageLayout = VK_IMAGE_LAYOUT_UNDEFINED;
  imageInfo._20_4_ = 0;
  VVar4 = (VkDescriptorPoolSize)
          (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
          m_internal;
  if (VVar4 != (VkDescriptorPoolSize)0x0) {
    pDVar5 = (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
             m_deviceIface;
    poolSizes = VVar4;
    (*pDVar5->_vptr_DeviceInterface[0x3d])
              (pDVar5,(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.
                      deleter.m_device,
               (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter
               .m_pool.m_internal,1);
  }
  *(undefined4 *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_device =
       binding.pImmutableSamplers._0_4_;
  *(undefined4 *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_device + 4) = binding.pImmutableSamplers._4_4_;
  *(undefined4 *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.m_pool.
    m_internal = 0;
  *(undefined4 *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_pool.m_internal + 4) = 0;
  *(deUint32 *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.m_internal
       = binding.binding;
  *(VkDescriptorType *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
           m_internal + 4) = binding.descriptorType;
  *(deUint32 *)
   &(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
    m_deviceIface = binding.descriptorCount;
  *(VkShaderStageFlags *)
   ((long)&(this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.deleter.
           m_deviceIface + 4) = binding.stageFlags;
  if (imageInfo.sampler.m_internal != 0) {
    binding.binding = (undefined4)imageInfo.sampler.m_internal;
    binding.descriptorType = imageInfo.sampler.m_internal._4_4_;
    (**(code **)(*(long *)imageInfo.imageView.m_internal + 0x1e8))
              (imageInfo.imageView.m_internal,imageInfo._16_8_,0,1);
  }
  binding.binding = 0xf;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers = (VkSampler *)((ulong)binding.pImmutableSamplers & 0xffffffff00000000)
  ;
  ::vk::createImageView
            ((Move<vk::Handle<(vk::HandleType)13>_> *)&poolSizes,deviceInterface,device,
             (VkImageViewCreateInfo *)&binding,(VkAllocationCallbacks *)0x0);
  pVVar6 = DStack_110.m_allocator;
  imageInfo._16_8_ = DStack_110.m_device;
  imageInfo.sampler.m_internal._0_4_ = poolSizes.type;
  imageInfo.sampler.m_internal._4_4_ = poolSizes.descriptorCount;
  imageInfo.imageView.m_internal = (deUint64)DStack_110.m_deviceIface;
  poolSizes.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  poolSizes.descriptorCount = 0;
  DStack_110.m_deviceIface = (DeviceInterface *)0x0;
  DStack_110.m_device = (VkDevice)0x0;
  DStack_110.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_00.m_internal =
       (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  if (obj_00.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&(this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter,
               obj_00);
  }
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_device =
       (VkDevice)imageInfo._16_8_;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_allocator =
       pVVar6;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal =
       imageInfo.sampler.m_internal;
  (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageInfo.imageView.m_internal;
  if (poolSizes != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)13>_>::operator()
              (&DStack_110,(VkImageView)poolSizes);
  }
  puVar9 = &DAT_00b57488;
  pVVar10 = (VkSamplerCreateInfo *)&binding;
  for (lVar8 = 10; lVar8 != 0; lVar8 = lVar8 + -1) {
    *(undefined8 *)pVVar10 = *puVar9;
    puVar9 = puVar9 + (ulong)bVar11 * -2 + 1;
    pVVar10 = (VkSamplerCreateInfo *)((long)pVVar10 + (ulong)bVar11 * -0x10 + 8);
  }
  ::vk::createSampler((Move<vk::Handle<(vk::HandleType)20>_> *)&poolSizes,deviceInterface,device,
                      (VkSamplerCreateInfo *)&binding,(VkAllocationCallbacks *)0x0);
  pVVar6 = DStack_110.m_allocator;
  imageInfo._16_8_ = DStack_110.m_device;
  imageInfo.sampler.m_internal._0_4_ = poolSizes.type;
  imageInfo.sampler.m_internal._4_4_ = poolSizes.descriptorCount;
  imageInfo.imageView.m_internal = (deUint64)DStack_110.m_deviceIface;
  poolSizes.type = VK_DESCRIPTOR_TYPE_SAMPLER;
  poolSizes.descriptorCount = 0;
  DStack_110.m_deviceIface = (DeviceInterface *)0x0;
  DStack_110.m_device = (VkDevice)0x0;
  DStack_110.m_allocator = (VkAllocationCallbacks *)0x0;
  obj_01.m_internal =
       (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  if (obj_01.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
              (&(this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter,
               obj_01);
  }
  (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_device =
       (VkDevice)imageInfo._16_8_;
  (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_allocator =
       pVVar6;
  (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal =
       imageInfo.sampler.m_internal;
  (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)imageInfo.imageView.m_internal;
  if (poolSizes != (VkDescriptorPoolSize)0x0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)20>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)20>_> *)&DStack_110,(VkSampler)poolSizes);
  }
  imageInfo.sampler.m_internal =
       (this->m_sampler).super_RefBase<vk::Handle<(vk::HandleType)20>_>.m_data.object.m_internal;
  imageInfo.imageView.m_internal =
       (this->m_imageView).super_RefBase<vk::Handle<(vk::HandleType)13>_>.m_data.object.m_internal;
  imageInfo.imageLayout = context->m_context->m_currentImageLayout;
  binding.binding = 0x23;
  binding.descriptorCount = 0;
  binding.stageFlags = 0;
  binding.pImmutableSamplers =
       (VkSampler *)
       (this->m_descriptorSet).super_RefBase<vk::Handle<(vk::HandleType)22>_>.m_data.object.
       m_internal;
  (*deviceInterface->_vptr_DeviceInterface[0x3e])(deviceInterface,device,1,&binding,0,0);
  if (bindings.
      super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(bindings.
                    super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)bindings.
                          super__Vector_base<vk::VkDescriptorSetLayoutBinding,_std::allocator<vk::VkDescriptorSetLayoutBinding>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_78.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_70,local_78);
  }
  if (local_58.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)14>_>::operator()(&DStack_50,local_58);
  }
  return;
}

Assistant:

void RenderVertexSampledImage::prepare (PrepareRenderPassContext& context)
{
	const vk::DeviceInterface&					vkd						= context.getContext().getDeviceInterface();
	const vk::VkDevice							device					= context.getContext().getDevice();
	const vk::VkRenderPass						renderPass				= context.getRenderPass();
	const deUint32								subpass					= 0;
	const vk::Unique<vk::VkShaderModule>		vertexShaderModule		(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("sampled-image.vert"), 0));
	const vk::Unique<vk::VkShaderModule>		fragmentShaderModule	(vk::createShaderModule(vkd, device, context.getBinaryCollection().get("render-white.frag"), 0));
	vector<vk::VkDescriptorSetLayoutBinding>	bindings;

	{
		const vk::VkDescriptorSetLayoutBinding binding =
		{
			0u,
			vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
			1,
			vk::VK_SHADER_STAGE_VERTEX_BIT,
			DE_NULL
		};

		bindings.push_back(binding);
	}

	createPipelineWithResources(vkd, device, renderPass, subpass, *vertexShaderModule, *fragmentShaderModule, context.getTargetWidth(), context.getTargetHeight(),
								vector<vk::VkVertexInputBindingDescription>(), vector<vk::VkVertexInputAttributeDescription>(), bindings, vk::VK_PRIMITIVE_TOPOLOGY_POINT_LIST, 0u, DE_NULL, m_resources);

	{
		const vk::VkDescriptorPoolSize			poolSizes		=
		{
			vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
			1
		};
		const vk::VkDescriptorPoolCreateInfo	createInfo		=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_POOL_CREATE_INFO,
			DE_NULL,
			vk::VK_DESCRIPTOR_POOL_CREATE_FREE_DESCRIPTOR_SET_BIT,

			1u,
			1u,
			&poolSizes,
		};

		m_descriptorPool = vk::createDescriptorPool(vkd, device, &createInfo);
	}

	{
		const vk::VkDescriptorSetLayout			layout			= *m_resources.descriptorSetLayout;
		const vk::VkDescriptorSetAllocateInfo	allocateInfo	=
		{
			vk::VK_STRUCTURE_TYPE_DESCRIPTOR_SET_ALLOCATE_INFO,
			DE_NULL,

			*m_descriptorPool,
			1,
			&layout
		};

		m_descriptorSet = vk::allocateDescriptorSet(vkd, device, &allocateInfo);

		{
			const vk::VkImageViewCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_IMAGE_VIEW_CREATE_INFO,
				DE_NULL,
				0u,

				context.getImage(),
				vk::VK_IMAGE_VIEW_TYPE_2D,
				vk::VK_FORMAT_R8G8B8A8_UNORM,
				vk::makeComponentMappingRGBA(),
				{
					vk::VK_IMAGE_ASPECT_COLOR_BIT,
					0u,
					1u,
					0u,
					1u
				}
			};

			m_imageView = vk::createImageView(vkd, device, &createInfo);
		}

		{
			const vk::VkSamplerCreateInfo createInfo =
			{
				vk::VK_STRUCTURE_TYPE_SAMPLER_CREATE_INFO,
				DE_NULL,
				0u,

				vk::VK_FILTER_NEAREST,
				vk::VK_FILTER_NEAREST,

				vk::VK_SAMPLER_MIPMAP_MODE_LINEAR,
				vk::VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,
				vk::VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,
				vk::VK_SAMPLER_ADDRESS_MODE_CLAMP_TO_EDGE,
				0.0f,
				VK_FALSE,
				1.0f,
				VK_FALSE,
				vk::VK_COMPARE_OP_ALWAYS,
				0.0f,
				0.0f,
				vk::VK_BORDER_COLOR_FLOAT_TRANSPARENT_BLACK,
				VK_FALSE
			};

			m_sampler = vk::createSampler(vkd, device, &createInfo);
		}

		{
			const vk::VkDescriptorImageInfo			imageInfo	=
			{
				*m_sampler,
				*m_imageView,
				context.getImageLayout()
			};
			const vk::VkWriteDescriptorSet			write		=
			{
				vk::VK_STRUCTURE_TYPE_WRITE_DESCRIPTOR_SET,
				DE_NULL,
				*m_descriptorSet,
				0u,
				0u,
				1u,
				vk::VK_DESCRIPTOR_TYPE_COMBINED_IMAGE_SAMPLER,
				&imageInfo,
				DE_NULL,
				DE_NULL,
			};

			vkd.updateDescriptorSets(device, 1u, &write, 0u, DE_NULL);
		}
	}
}